

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int archive_read_support_format_rar(archive *_a)

{
  int iVar1;
  int iVar2;
  void *__s;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_rar");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    __s = malloc(0x4ef0);
    if (__s == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate rar data");
    }
    else {
      memset(__s,0,0x4ef0);
      *(undefined4 *)((long)__s + 0x4ee8) = 0xffffffff;
      iVar2 = __archive_read_register_format
                        ((archive_read *)_a,__s,"rar",archive_read_format_rar_bid,
                         archive_read_format_rar_options,archive_read_format_rar_read_header,
                         archive_read_format_rar_read_data,archive_read_format_rar_read_data_skip,
                         archive_read_format_rar_seek_data,archive_read_format_rar_cleanup,
                         archive_read_support_format_rar_capabilities,
                         archive_read_format_rar_has_encrypted_entries);
      if (iVar2 != 0) {
        free(__s);
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_format_rar(struct archive *_a)
{
  struct archive_read *a = (struct archive_read *)_a;
  struct rar *rar;
  int r;

  archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
                      "archive_read_support_format_rar");

  rar = (struct rar *)malloc(sizeof(*rar));
  if (rar == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Can't allocate rar data");
    return (ARCHIVE_FATAL);
  }
  memset(rar, 0, sizeof(*rar));

	/*
	 * Until enough data has been read, we cannot tell about
	 * any encrypted entries yet.
	 */
	rar->has_encrypted_entries = ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;

  r = __archive_read_register_format(a,
                                     rar,
                                     "rar",
                                     archive_read_format_rar_bid,
                                     archive_read_format_rar_options,
                                     archive_read_format_rar_read_header,
                                     archive_read_format_rar_read_data,
                                     archive_read_format_rar_read_data_skip,
                                     archive_read_format_rar_seek_data,
                                     archive_read_format_rar_cleanup,
                                     archive_read_support_format_rar_capabilities,
                                     archive_read_format_rar_has_encrypted_entries);

  if (r != ARCHIVE_OK)
    free(rar);
  return (r);
}